

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O1

void __thiscall adios2::core::engine::InlineWriter::ResetVariables(InlineWriter *this)

{
  _Rb_tree_node_base *name;
  pointer pBVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  pointer pBVar7;
  pointer pBVar8;
  pointer pBVar9;
  DataType DVar10;
  Variable<unsigned_char> *pVVar11;
  Variable<std::complex<float>_> *pVVar12;
  Variable<std::complex<double>_> *pVVar13;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pVVar14;
  Variable<long_double> *pVVar15;
  Variable<float> *pVVar16;
  _Rb_tree_node_base *p_Var17;
  pointer this_00;
  pointer pBVar18;
  pointer pBVar19;
  pointer this_01;
  pointer this_02;
  pointer pBVar20;
  pointer pBVar21;
  pointer pBVar22;
  pointer pBVar23;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  availVars;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl._0_8_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  IO::GetAvailableVariables
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)&local_98,(this->super_Engine).m_IO,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_68);
  p_Var17 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_98._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_98._M_impl.super__Rb_tree_header) {
    do {
      name = p_Var17 + 1;
      DVar10 = IO::InquireVariableType((this->super_Engine).m_IO,(string *)name);
      switch(DVar10) {
      case Int8:
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"in call to BeginStep","");
        pVVar11 = (Variable<unsigned_char> *)
                  Engine::FindVariable<signed_char>(&this->super_Engine,(string *)name,&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
        pBVar22 = (pointer)(((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                              *)&pVVar11->m_BlocksInfo)->
                           super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                           )._M_impl.super__Vector_impl_data._M_start;
        pBVar1 = (pointer)(((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                             *)&pVVar11->m_BlocksInfo)->
                          super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
        pBVar19 = pBVar22;
        if (pBVar1 != pBVar22) {
          do {
            Variable<signed_char>::BPInfo::~BPInfo((BPInfo *)pBVar19);
            pBVar19 = pBVar19 + 1;
          } while (pBVar19 != pBVar1);
LAB_004a0f05:
          (((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
             *)&pVVar11->m_BlocksInfo)->
          super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)pBVar22;
        }
        break;
      case Int16:
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f8,"in call to BeginStep","");
        pVVar11 = (Variable<unsigned_char> *)
                  Engine::FindVariable<short>(&this->super_Engine,(string *)name,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
        pBVar22 = (pointer)(((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                              *)&pVVar11->m_BlocksInfo)->
                           super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                           )._M_impl.super__Vector_impl_data._M_start;
        pBVar1 = (pointer)(((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                             *)&pVVar11->m_BlocksInfo)->
                          super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
        pBVar19 = pBVar22;
        if (pBVar1 != pBVar22) {
          do {
            Variable<short>::BPInfo::~BPInfo((BPInfo *)pBVar19);
            pBVar19 = pBVar19 + 1;
          } while (pBVar19 != pBVar1);
          goto LAB_004a0f05;
        }
        break;
      case Int32:
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,"in call to BeginStep","");
        pVVar16 = (Variable<float> *)
                  Engine::FindVariable<int>(&this->super_Engine,(string *)name,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        pBVar23 = (pVVar16->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar9 = (pVVar16->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pBVar20 = pBVar23;
        if (pBVar9 != pBVar23) {
          do {
            Variable<int>::BPInfo::~BPInfo((BPInfo *)pBVar20);
            pBVar20 = pBVar20 + 1;
          } while (pBVar20 != pBVar9);
LAB_004a111a:
          (pVVar16->m_BlocksInfo).
          super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = pBVar23;
        }
        break;
      case Int64:
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_138,"in call to BeginStep","");
        pVVar12 = (Variable<std::complex<float>_> *)
                  Engine::FindVariable<long>(&this->super_Engine,(string *)name,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        pBVar21 = (pVVar12->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar2 = (pVVar12->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pBVar18 = pBVar21;
        if (pBVar2 != pBVar21) {
          do {
            Variable<long>::BPInfo::~BPInfo((BPInfo *)pBVar18);
            pBVar18 = pBVar18 + 1;
          } while (pBVar18 != pBVar2);
LAB_004a0df9:
          (pVVar12->m_BlocksInfo).
          super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = pBVar21;
        }
        break;
      case UInt8:
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_158,"in call to BeginStep","");
        pVVar11 = Engine::FindVariable<unsigned_char>(&this->super_Engine,(string *)name,&local_158)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        pBVar22 = (pVVar11->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar1 = (pVVar11->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pBVar19 = pBVar22;
        if (pBVar1 != pBVar22) {
          do {
            Variable<unsigned_char>::BPInfo::~BPInfo(pBVar19);
            pBVar19 = pBVar19 + 1;
          } while (pBVar19 != pBVar1);
          goto LAB_004a0f05;
        }
        break;
      case UInt16:
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_178,"in call to BeginStep","");
        pVVar11 = (Variable<unsigned_char> *)
                  Engine::FindVariable<unsigned_short>
                            (&this->super_Engine,(string *)name,&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        pBVar22 = (pVVar11->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar1 = (pVVar11->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<unsigned_char>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_char>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pBVar19 = pBVar22;
        if (pBVar1 != pBVar22) {
          do {
            Variable<unsigned_short>::BPInfo::~BPInfo((BPInfo *)pBVar19);
            pBVar19 = pBVar19 + 1;
          } while (pBVar19 != pBVar1);
          goto LAB_004a0f05;
        }
        break;
      case UInt32:
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_198,"in call to BeginStep","");
        pVVar16 = (Variable<float> *)
                  Engine::FindVariable<unsigned_int>(&this->super_Engine,(string *)name,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        pBVar23 = (pVVar16->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar9 = (pVVar16->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pBVar20 = pBVar23;
        if (pBVar9 != pBVar23) {
          do {
            Variable<unsigned_int>::BPInfo::~BPInfo((BPInfo *)pBVar20);
            pBVar20 = pBVar20 + 1;
          } while (pBVar20 != pBVar9);
          goto LAB_004a111a;
        }
        break;
      case UInt64:
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b8,"in call to BeginStep","");
        pVVar12 = (Variable<std::complex<float>_> *)
                  Engine::FindVariable<unsigned_long>(&this->super_Engine,(string *)name,&local_1b8)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        pBVar21 = (pVVar12->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar2 = (pVVar12->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pBVar18 = pBVar21;
        if (pBVar2 != pBVar21) {
          do {
            Variable<unsigned_long>::BPInfo::~BPInfo((BPInfo *)pBVar18);
            pBVar18 = pBVar18 + 1;
          } while (pBVar18 != pBVar2);
          goto LAB_004a0df9;
        }
        break;
      case Float:
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d8,"in call to BeginStep","");
        pVVar16 = Engine::FindVariable<float>(&this->super_Engine,(string *)name,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p);
        }
        pBVar23 = (pVVar16->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar9 = (pVVar16->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pBVar20 = pBVar23;
        if (pBVar9 != pBVar23) {
          do {
            Variable<float>::BPInfo::~BPInfo(pBVar20);
            pBVar20 = pBVar20 + 1;
          } while (pBVar20 != pBVar9);
          goto LAB_004a111a;
        }
        break;
      case Double:
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f8,"in call to BeginStep","");
        pVVar12 = (Variable<std::complex<float>_> *)
                  Engine::FindVariable<double>(&this->super_Engine,(string *)name,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
        pBVar21 = (pVVar12->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar2 = (pVVar12->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pBVar18 = pBVar21;
        if (pBVar2 != pBVar21) {
          do {
            Variable<double>::BPInfo::~BPInfo((BPInfo *)pBVar18);
            pBVar18 = pBVar18 + 1;
          } while (pBVar18 != pBVar2);
          goto LAB_004a0df9;
        }
        break;
      case LongDouble:
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_218,"in call to BeginStep","");
        pVVar15 = Engine::FindVariable<long_double>(&this->super_Engine,(string *)name,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
        pBVar7 = (pVVar15->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar8 = (pVVar15->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        this_02 = pBVar7;
        if (pBVar8 != pBVar7) {
          do {
            Variable<long_double>::BPInfo::~BPInfo(this_02);
            this_02 = this_02 + 1;
          } while (this_02 != pBVar8);
          (pVVar15->m_BlocksInfo).
          super__Vector_base<adios2::core::Variable<long_double>::BPInfo,_std::allocator<adios2::core::Variable<long_double>::BPInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = pBVar7;
        }
        break;
      case FloatComplex:
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"in call to BeginStep","");
        pVVar12 = Engine::FindVariable<std::complex<float>>
                            (&this->super_Engine,(string *)name,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        pBVar21 = (pVVar12->m_BlocksInfo).
                  super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar2 = (pVVar12->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pBVar18 = pBVar21;
        if (pBVar2 != pBVar21) {
          do {
            Variable<std::complex<float>_>::BPInfo::~BPInfo(pBVar18);
            pBVar18 = pBVar18 + 1;
          } while (pBVar18 != pBVar2);
          goto LAB_004a0df9;
        }
        break;
      case DoubleComplex:
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_258,"in call to BeginStep","");
        pVVar13 = Engine::FindVariable<std::complex<double>>
                            (&this->super_Engine,(string *)name,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p);
        }
        pBVar3 = (pVVar13->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar4 = (pVVar13->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        this_00 = pBVar3;
        if (pBVar4 != pBVar3) {
          do {
            Variable<std::complex<double>_>::BPInfo::~BPInfo(this_00);
            this_00 = this_00 + 1;
          } while (this_00 != pBVar4);
          (pVVar13->m_BlocksInfo).
          super__Vector_base<adios2::core::Variable<std::complex<double>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<double>_>::BPInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = pBVar3;
        }
        break;
      case String:
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"in call to BeginStep","");
        pVVar14 = Engine::FindVariable<std::__cxx11::string>
                            (&this->super_Engine,(string *)name,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        pBVar5 = (pVVar14->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar6 = (pVVar14->m_BlocksInfo).
                 super__Vector_base<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        this_01 = pBVar5;
        if (pBVar6 != pBVar5) {
          do {
            Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::BPInfo::~BPInfo(this_01);
            this_01 = this_01 + 1;
          } while (this_01 != pBVar6);
          (pVVar14->m_BlocksInfo).
          super__Vector_base<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo,_std::allocator<adios2::core::Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BPInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish = pBVar5;
        }
        break;
      case Char:
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d8,"in call to BeginStep","");
        pVVar11 = (Variable<unsigned_char> *)
                  Engine::FindVariable<char>(&this->super_Engine,(string *)name,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        pBVar22 = (pointer)(((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                              *)&pVVar11->m_BlocksInfo)->
                           super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                           )._M_impl.super__Vector_impl_data._M_start;
        pBVar1 = (pointer)(((vector<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                             *)&pVVar11->m_BlocksInfo)->
                          super__Vector_base<adios2::core::Variable<char>::BPInfo,_std::allocator<adios2::core::Variable<char>::BPInfo>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
        pBVar19 = pBVar22;
        if (pBVar1 != pBVar22) {
          do {
            Variable<char>::BPInfo::~BPInfo((BPInfo *)pBVar19);
            pBVar19 = pBVar19 + 1;
          } while (pBVar19 != pBVar1);
          goto LAB_004a0f05;
        }
      }
      p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    } while ((_Rb_tree_header *)p_Var17 != &local_98._M_impl.super__Rb_tree_header);
  }
  this->m_ResetVariables = false;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~_Rb_tree(&local_98);
  return;
}

Assistant:

void InlineWriter::ResetVariables()
{
    auto availVars = m_IO.GetAvailableVariables();
    for (auto &varPair : availVars)
    {
        const auto &name = varPair.first;
        const DataType type = m_IO.InquireVariableType(name);

        if (type == DataType::Struct)
        {
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> &variable = FindVariable<T>(name, "in call to BeginStep");                     \
        variable.m_BlocksInfo.clear();                                                             \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    }
    m_ResetVariables = false;
}